

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O0

void fiobj_ary_unshift(FIOBJ ary,FIOBJ obj)

{
  size_t sVar1;
  FIOBJ obj_local;
  FIOBJ ary_local;
  
  if (ary != 0) {
    sVar1 = fiobj_type_is(ary,FIOBJ_T_ARRAY);
    if (sVar1 != 0) {
      fio_ary___unshift((fio_ary___s *)(ary + 8),obj);
      return;
    }
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0xab,"void fiobj_ary_unshift(FIOBJ, FIOBJ)");
}

Assistant:

void fiobj_ary_unshift(FIOBJ ary, FIOBJ obj) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  fio_ary___unshift(&obj2ary(ary)->ary, obj);
}